

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.h
# Opt level: O3

void __thiscall
wasm::BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier>::visitBlock
          (BinaryenIRWriter<wasm::(anonymous_namespace)::Poppifier> *this,Block *curr)

{
  pointer ppBVar1;
  Block *pBVar2;
  Expression *pEVar3;
  Function *pFVar4;
  SpecificExpression<(wasm::Expression::Id)1> *pSVar5;
  uint uVar6;
  Expression *local_60;
  Expression *pEStack_58;
  vector<wasm::Block_*,_std::allocator<wasm::Block_*>_> parents;
  Block *local_38;
  Block *curr_local;
  
  local_38 = curr;
  if ((curr->name).super_IString.str._M_str == (char *)0x0) {
    uVar6 = 0;
    do {
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= (ulong)uVar6) {
        return;
      }
      pEVar3 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar6];
      visit(this,pEVar3);
      uVar6 = uVar6 + 1;
    } while ((pEVar3->type).id != 1);
  }
  else if (((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
            usedElements == 0) ||
          ((*(curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
             .data)->_id != BlockId)) {
    emit(this,(Expression *)curr);
    uVar6 = 0;
    do {
      if ((curr->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= (ulong)uVar6) break;
      pEVar3 = (curr->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar6];
      visit(this,pEVar3);
      uVar6 = uVar6 + 1;
    } while ((pEVar3->type).id != 1);
    emitScopeEnd(this,(Expression *)curr);
    if ((curr->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 1) {
      pFVar4 = this[4].func;
      pEStack_58 = (Expression *)
                   MixedArena::allocSpace
                             ((MixedArena *)
                              &((this[2].func)->epilogLocation)._M_t._M_impl.super__Rb_tree_header.
                               _M_header._M_parent,0x10,8);
      pEStack_58->_id = UnreachableId;
      (pEStack_58->type).id = 1;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &pFVar4[-1].delimiterLocations._M_h._M_single_bucket,&pEStack_58);
    }
  }
  else {
    pEStack_58 = (Expression *)0x0;
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38 = curr;
    do {
      pBVar2 = (Block *)*(local_38->list).
                         super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                         data;
      if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression._id !=
          BlockId) break;
      if (parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
          super__Vector_impl_data._M_start ==
          parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<wasm::Block*,std::allocator<wasm::Block*>>::
        _M_realloc_insert<wasm::Block*const&>
                  ((vector<wasm::Block*,std::allocator<wasm::Block*>> *)&pEStack_58,
                   (iterator)
                   parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl
                   .super__Vector_impl_data._M_start,&local_38);
      }
      else {
        *parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
         super__Vector_impl_data._M_start = local_38;
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start =
             parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      emit(this,(Expression *)local_38);
      local_38 = pBVar2;
    } while ((pBVar2->list).
             super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements
             != 0);
    emit(this,(Expression *)local_38);
    pBVar2 = local_38;
    uVar6 = 0;
    do {
      if ((pBVar2->list).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
          usedElements <= (ulong)uVar6) break;
      pEVar3 = (pBVar2->list).
               super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
               [uVar6];
      visit(this,pEVar3);
      uVar6 = uVar6 + 1;
    } while ((pEVar3->type).id != 1);
    pBVar2 = local_38;
    emitScopeEnd(this,(Expression *)local_38);
    if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id == 1) {
      pFVar4 = this[4].func;
      local_60 = (Expression *)
                 MixedArena::allocSpace
                           ((MixedArena *)
                            &((this[2].func)->epilogLocation)._M_t._M_impl.super__Rb_tree_header.
                             _M_header._M_parent,0x10,8);
      local_60->_id = UnreachableId;
      (local_60->type).id = 1;
      std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
      emplace_back<wasm::Expression*>
                ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                 &pFVar4[-1].delimiterLocations._M_h._M_single_bucket,&local_60);
    }
    if (pEStack_58 !=
        (Expression *)
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      pBVar2 = local_38;
      do {
        pSVar5 = &pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>;
        ppBVar1 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                  super__Vector_impl_data._M_start + -1;
        pBVar2 = parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
                 super__Vector_impl_data._M_start[-1];
        parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
        super__Vector_impl_data._M_start = ppBVar1;
        if ((pSVar5->super_Expression).type.id != 1) {
          uVar6 = 1;
          do {
            if ((pBVar2->list).
                super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                usedElements <= (ulong)uVar6) break;
            pEVar3 = (pBVar2->list).
                     super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                     [uVar6];
            visit(this,pEVar3);
            uVar6 = uVar6 + 1;
          } while ((pEVar3->type).id != 1);
        }
        emitScopeEnd(this,(Expression *)pBVar2);
        if ((pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id ==
            1) {
          pFVar4 = this[4].func;
          local_60 = (Expression *)
                     MixedArena::allocSpace
                               ((MixedArena *)
                                &((this[2].func)->epilogLocation)._M_t._M_impl.super__Rb_tree_header
                                 ._M_header._M_parent,0x10,8);
          local_60->_id = UnreachableId;
          (local_60->type).id = 1;
          std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
          emplace_back<wasm::Expression*>
                    ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                     &pFVar4[-1].delimiterLocations._M_h._M_single_bucket,&local_60);
        }
      } while (pEStack_58 !=
               (Expression *)
               parents.super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>._M_impl.
               super__Vector_impl_data._M_start);
    }
    if (pEStack_58 != (Expression *)0x0) {
      operator_delete(pEStack_58,
                      (long)parents.
                            super__Vector_base<wasm::Block_*,_std::allocator<wasm::Block_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pEStack_58);
    }
  }
  return;
}

Assistant:

void BinaryenIRWriter<SubType>::visitBlock(Block* curr) {
  auto visitChildren = [this](Block* curr, Index from) {
    auto& list = curr->list;
    while (from < list.size()) {
      auto* child = list[from];
      visit(child);
      if (child->type == Type::unreachable) {
        break;
      }
      ++from;
    }
  };

  // A block with no name never needs to be emitted: we can just emit its
  // contents. In some cases that will end up as "stacky" code, which is valid
  // in wasm but not in Binaryen IR. This is similar to what we do in
  // visitPossibleBlockContents(), and like there, when we reload such a binary
  // we'll end up creating a block for it then.
  //
  // Note that in visitPossibleBlockContents() we also optimize the case of a
  // block with a name but the name actually has no uses - that handles more
  // cases, but it requires more work. It is reasonable to do it in
  // visitPossibleBlockContents() which handles the common cases of blocks that
  // are children of control flow structures (like an if arm); doing it here
  // would affect every block, including highly-nested block stacks, which would
  // end up as quadratic time. In optimized code the name will not exist if it's
  // not used anyhow, so a minor optimization for the unoptimized case that
  // leads to potential quadratic behavior is not worth it here.
  if (!curr->name.is()) {
    visitChildren(curr, 0);
    return;
  }

  auto afterChildren = [this](Block* curr) {
    emitScopeEnd(curr);
    if (curr->type == Type::unreachable) {
      // Since this block is unreachable, no instructions will be emitted after
      // it in its enclosing scope. That means that this block will be the last
      // instruction before the end of its parent scope, so its type must match
      // the type of its parent. But we don't have a concrete type for this
      // block and we don't know what type its parent expects, so we can't
      // ensure the types match. To work around this, we insert an `unreachable`
      // instruction after every unreachable control flow structure and depend
      // on its polymorphic behavior to paper over any type mismatches.
      emitUnreachable();
    }
  };

  // Handle very deeply nested blocks in the first position efficiently,
  // avoiding heavy recursion. We only start to do this if we see it will help
  // us (to avoid allocation of the vector).
  if (!curr->list.empty() && curr->list[0]->is<Block>()) {
    std::vector<Block*> parents;
    Block* child;
    while (!curr->list.empty() && (child = curr->list[0]->dynCast<Block>())) {
      parents.push_back(curr);
      emit(curr);
      curr = child;
    }
    // Emit the current block, which does not have a block as a child in the
    // first position.
    emit(curr);
    visitChildren(curr, 0);
    afterChildren(curr);
    bool childUnreachable = curr->type == Type::unreachable;
    // Finish the later parts of all the parent blocks.
    while (!parents.empty()) {
      auto* parent = parents.back();
      parents.pop_back();
      if (!childUnreachable) {
        visitChildren(parent, 1);
      }
      afterChildren(parent);
      childUnreachable = parent->type == Type::unreachable;
    }
    return;
  }
  // Simple case of not having a nested block in the first position.
  emit(curr);
  visitChildren(curr, 0);
  afterChildren(curr);
}